

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

QString * __thiscall QString::append(QString *this,QChar ch)

{
  char16_t *pcVar1;
  long lVar2;
  
  QArrayDataPointer<char16_t>::detachAndGrow
            (&this->d,GrowsAtEnd,1,(char16_t **)0x0,(QArrayDataPointer<char16_t> *)0x0);
  pcVar1 = (this->d).ptr;
  lVar2 = (this->d).size;
  (this->d).size = lVar2 + 1;
  pcVar1[lVar2] = ch.ucs;
  pcVar1[lVar2 + 1] = L'\0';
  return this;
}

Assistant:

QString &QString::append(QChar ch)
{
    d.detachAndGrow(QArrayData::GrowsAtEnd, 1, nullptr, nullptr);
    d->copyAppend(1, ch.unicode());
    d.data()[d.size] = '\0';
    return *this;
}